

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O0

string * __thiscall FactoredDecPOMDPDiscrete::SoftPrint_abi_cxx11_(FactoredDecPOMDPDiscrete *this)

{
  ostream *poVar1;
  ostream *poVar2;
  ostream *poVar3;
  const_reference ppRVar4;
  long in_RSI;
  string *in_RDI;
  Index i;
  stringstream ss;
  ostream *in_stack_fffffffffffffd58;
  ostream *in_stack_fffffffffffffd60;
  string local_210 [36];
  uint local_1ec;
  string local_1e8 [48];
  string local_1b8 [32];
  stringstream local_198 [16];
  ostream local_188 [176];
  DecPOMDP *in_stack_ffffffffffffff28;
  MultiAgentDecisionProcessDiscreteFactoredStates *in_stack_ffffffffffffffe8;
  
  std::__cxx11::stringstream::stringstream(local_198);
  MultiAgentDecisionProcessDiscreteFactoredStates::SoftPrint_abi_cxx11_(in_stack_ffffffffffffffe8);
  std::operator<<(local_188,local_1b8);
  std::__cxx11::string::~string(local_1b8);
  DecPOMDP::SoftPrint_abi_cxx11_(in_stack_ffffffffffffff28);
  std::operator<<(local_188,local_1e8);
  std::__cxx11::string::~string(local_1e8);
  poVar1 = std::operator<<(local_188,"FactoredDecPOMDPDiscrete contains ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(ulong *)(in_RSI + 0x618));
  poVar1 = std::operator<<(poVar1," local reward functions.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  for (local_1ec = 0; (ulong)local_1ec != *(ulong *)(in_RSI + 0x618); local_1ec = local_1ec + 1) {
    poVar2 = std::operator<<(local_188,"LRF ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar2,local_1ec);
    std::operator<<(poVar3," statefactor scope ");
    std::vector<Scope,_std::allocator<Scope>_>::at
              ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffd60,
               (size_type)in_stack_fffffffffffffd58);
    poVar3 = ::operator<<(poVar1,(Scope *)poVar2);
    std::operator<<(poVar3," agent scope ");
    std::vector<Scope,_std::allocator<Scope>_>::at
              ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffd60,
               (size_type)in_stack_fffffffffffffd58);
    poVar2 = ::operator<<(poVar1,(Scope *)poVar2);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    in_stack_fffffffffffffd60 = local_188;
    ppRVar4 = std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::at
                        ((vector<RewardModel_*,_std::allocator<RewardModel_*>_> *)
                         in_stack_fffffffffffffd60,(size_type)in_stack_fffffffffffffd58);
    (*((*ppRVar4)->super_RewardModelDiscreteInterface).super_QTableInterface._vptr_QTableInterface
      [5])(local_210);
    in_stack_fffffffffffffd58 = std::operator<<(in_stack_fffffffffffffd60,local_210);
    std::ostream::operator<<(in_stack_fffffffffffffd58,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_210);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

string FactoredDecPOMDPDiscrete::SoftPrint() const
{
    stringstream ss;
    ss << MultiAgentDecisionProcessDiscreteFactoredStates::SoftPrint();
    ss << DecPOMDP::SoftPrint();
    ss << "FactoredDecPOMDPDiscrete contains " << _m_nrLRFs
       << " local reward functions." << endl;
    for(Index i=0;i!=_m_nrLRFs;++i)
    {
        ss << "LRF " << i << " statefactor scope " << _m_sfScopes.at(i)
           << " agent scope " << _m_agScopes.at(i) << endl;
        ss << _m_LRFs.at(i)->SoftPrint() << endl;
    }
    
    //print components specific to FactoredDecPOMDPDiscrete:
    return(ss.str());
}